

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O2

void PopHead<stTimeoutItem_t,stTimeoutItemLink_t>(stTimeoutItemLink_t *apLink)

{
  stTimeoutItem_t *psVar1;
  stTimeoutItem_t *psVar2;
  
  psVar1 = apLink->head;
  if (psVar1 != (stTimeoutItem_t *)0x0) {
    if (psVar1 == apLink->tail) {
      apLink->tail = (stTimeoutItem_t *)0x0;
      psVar2 = (stTimeoutItem_t *)0x0;
    }
    else {
      psVar2 = psVar1->pNext;
    }
    apLink->head = psVar2;
    psVar1->pLink = (stTimeoutItemLink_t *)0x0;
    psVar1->pPrev = (stTimeoutItem_t *)0x0;
    psVar1->pNext = (stTimeoutItem_t *)0x0;
    if (psVar2 != (stTimeoutItem_t *)0x0) {
      psVar2->pPrev = (stTimeoutItem_t *)0x0;
    }
  }
  return;
}

Assistant:

void inline PopHead( TLink*apLink )
{
	if( !apLink->head ) 
	{
		return ;
	}
	TNode *lp = apLink->head;
	if( apLink->head == apLink->tail )
	{
		apLink->head = apLink->tail = NULL;
	}
	else
	{
		apLink->head = apLink->head->pNext;
	}

	lp->pPrev = lp->pNext = NULL;
	lp->pLink = NULL;

	if( apLink->head )
	{
		apLink->head->pPrev = NULL;
	}
}